

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::HasProperty
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,PropertyId propertyId,bool *noRedecl
          ,PropertyValueInfo *info)

{
  byte bVar1;
  ScriptContext *this_00;
  bool bVar2;
  BOOL BVar3;
  BOOL BVar4;
  undefined8 in_RAX;
  ulong uVar5;
  anon_union_8_2_5e5949cc_for_SimplePropertyDescriptor_1 *paVar6;
  ulong uVar7;
  uint32 local_34 [2];
  uint32 indexVal;
  
  local_34[0] = (uint32)((ulong)in_RAX >> 0x20);
  if (noRedecl != (bool *)0x0) {
    *noRedecl = false;
  }
  uVar5 = 0;
  uVar7 = (ulong)(uint)this->propertyCount;
  if (this->propertyCount < 1) {
    uVar7 = uVar5;
  }
  paVar6 = &this->descriptors[0].field_1;
  while( true ) {
    if (uVar7 == uVar5) {
      this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                super_JavascriptLibraryBase).scriptContext.ptr;
      bVar2 = DynamicObject::HasObjectArray(instance);
      BVar4 = 0;
      if ((bVar2) &&
         (BVar3 = ScriptContext::IsNumericPropertyId(this_00,propertyId,local_34), BVar3 != 0)) {
        BVar4 = DynamicTypeHandler::HasItem(&this->super_DynamicTypeHandler,instance,local_34[0]);
      }
      return BVar4;
    }
    if (((((Type *)(paVar6 + -1))->Id).ptr)->pid == propertyId) break;
    uVar5 = uVar5 + 1;
    paVar6 = paVar6 + 2;
  }
  if ((paVar6->Attributes & 8) != 0) {
    return 0;
  }
  if (0x3f < paVar6->Attributes && noRedecl != (bool *)0x0) {
    *noRedecl = true;
  }
  if (info == (PropertyValueInfo *)0x0) {
    return 1;
  }
  bVar1 = paVar6->Attributes;
  info->m_instance = &instance->super_RecyclableObject;
  info->m_propertyIndex = (PropertyIndex)uVar5;
  info->m_attributes = bVar1;
  info->flags = InlineCacheNoFlags;
  return 1;
}

Assistant:

BOOL SimpleTypeHandler<size>::HasProperty(DynamicObject* instance, PropertyId propertyId, __out_opt bool *noRedecl, _Inout_opt_ PropertyValueInfo* info)
    {
        if (noRedecl != nullptr)
        {
            *noRedecl = false;
        }

        for (int i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->GetPropertyId() == propertyId)
            {
                if (descriptors[i].Attributes & PropertyDeleted)
                {
                    return false;
                }
                if (noRedecl && descriptors[i].Attributes & PropertyNoRedecl)
                {
                    *noRedecl = true;
                }

                if (info)
                {
                    PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(i), descriptors[i].Attributes);
                }
                return true;
            }
        }

        // Check numeric propertyId only if objectArray available
        uint32 indexVal;
        ScriptContext* scriptContext = instance->GetScriptContext();
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::HasItem(instance, indexVal);
        }

        return false;
    }